

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

bool __thiscall
wasm::InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_>::insert
          (InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_> *this,
          pair<wasm::Name,_wasm::Type> *val)

{
  _Self *p_Var1;
  pointer ppVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_false,_true>,_bool>
  pVar3;
  _List_iterator<std::pair<wasm::Name,_wasm::Type>_> local_78;
  type_conflict1 *local_70;
  type_conflict1 *inserted;
  type *it;
  undefined1 local_58;
  _List_iterator<std::pair<wasm::Name,_wasm::Type>_> local_50;
  pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>
  local_48;
  pair<std::__detail::_Node_iterator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_false,_true>,_bool>
  local_28;
  pair<wasm::Name,_wasm::Type> *local_18;
  pair<wasm::Name,_wasm::Type> *val_local;
  InsertOrderedSet<std::pair<wasm::Name,_wasm::Type>_> *this_local;
  
  local_18 = val;
  val_local = (pair<wasm::Name,_wasm::Type> *)this;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
       ::begin(&this->List);
  std::
  pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>
  ::pair<std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>,_true>(&local_48,val,&local_50);
  pVar3 = std::
          unordered_map<std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>,_std::hash<std::pair<wasm::Name,_wasm::Type>_>,_std::equal_to<std::pair<wasm::Name,_wasm::Type>_>,_std::allocator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>_>_>
          ::insert(&this->Map,&local_48);
  it = (type *)pVar3.first.
               super__Node_iterator_base<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_true>
               ._M_cur;
  local_58 = pVar3.second;
  local_28.first.
  super__Node_iterator_base<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_true>
               )it;
  local_28.second = (bool)local_58;
  inserted = (type_conflict1 *)
             std::
             get<0ul,std::__detail::_Node_iterator<std::pair<std::pair<wasm::Name,wasm::Type>const,std::_List_iterator<std::pair<wasm::Name,wasm::Type>>>,false,true>,bool>
                       (&local_28);
  local_70 = std::
             get<1ul,std::__detail::_Node_iterator<std::pair<std::pair<wasm::Name,wasm::Type>const,std::_List_iterator<std::pair<wasm::Name,wasm::Type>>>,false,true>,bool>
                       (&local_28);
  if ((*local_70 & 1U) != 0) {
    std::__cxx11::
    list<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>::
    push_back(&this->List,local_18);
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<wasm::Name,_wasm::Type>,_std::allocator<std::pair<wasm::Name,_wasm::Type>_>_>
         ::end(&this->List);
    p_Var1 = std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>::operator--(&local_78);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::pair<wasm::Name,_wasm::Type>,_std::_List_iterator<std::pair<wasm::Name,_wasm::Type>_>_>,_false,_true>
                           *)inserted);
    (ppVar2->second)._M_node = p_Var1->_M_node;
  }
  return (bool)(*local_70 & 1);
}

Assistant:

bool insert(const T& val) {
    auto [it, inserted] = Map.insert({val, List.begin()});
    if (inserted) {
      List.push_back(val);
      it->second = --List.end();
    }
    return inserted;
  }